

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldLabel_Test::
DescriptorTest_FieldLabel_Test(DescriptorTest_FieldLabel_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_DescriptorTest).super_Test._vptr_Test = (_func_int **)&PTR__DescriptorTest_01882318;
  DescriptorPool::DescriptorPool(&(this->super_DescriptorTest).pool_);
  (this->super_DescriptorTest).super_Test._vptr_Test = (_func_int **)&PTR__DescriptorTest_01877470;
  return;
}

Assistant:

TEST_F(DescriptorTest, FieldLabel) {
  EXPECT_EQ(FieldDescriptor::LABEL_REQUIRED, foo_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_OPTIONAL, bar_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_REPEATED, baz_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_OPTIONAL, moo_->label());

  EXPECT_TRUE(foo_->is_required());
  EXPECT_FALSE(foo_->is_optional());
  EXPECT_FALSE(foo_->is_repeated());

  EXPECT_FALSE(bar_->is_required());
  EXPECT_TRUE(bar_->is_optional());
  EXPECT_FALSE(bar_->is_repeated());

  EXPECT_FALSE(baz_->is_required());
  EXPECT_FALSE(baz_->is_optional());
  EXPECT_TRUE(baz_->is_repeated());
}